

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerBailOnNotString(Lowerer *this,Instr *instr)

{
  OpCode opcode;
  bool bVar1;
  Opnd *dstOpnd;
  Opnd *src1Opnd;
  Instr *instr_00;
  LabelInstr *continueLabel;
  LabelInstr *labelHelper;
  RegOpnd *srcReg;
  ValueType local_32;
  
  bVar1 = ValueType::IsString(&local_32);
  if (bVar1) {
    IR::Instr::ClearBailOutInfo(instr);
  }
  else {
    opcode = instr->m_opcode;
    dstOpnd = IR::Instr::UnlinkDst(instr);
    src1Opnd = IR::Instr::UnlinkSrc1(instr);
    instr_00 = IR::Instr::New(opcode,dstOpnd,src1Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    continueLabel = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertAfter(instr,&continueLabel->super_Instr);
    bVar1 = IR::Opnd::IsRegOpnd(instr_00->m_src1);
    if (bVar1) {
      srcReg = IR::Opnd::AsRegOpnd(instr_00->m_src1);
    }
    else {
      srcReg = (RegOpnd *)0x0;
    }
    GenerateStringTest(this,srcReg,instr,labelHelper,continueLabel,true);
    GenerateBailOut(this,instr,(BranchInstr *)0x0,labelHelper,(LabelInstr *)0x0);
  }
  return;
}

Assistant:

void Lowerer::LowerBailOnNotString(IR::Instr *instr)
{
    if (!instr->GetSrc1()->GetValueType().IsString())
    {
        /*Creating a MOV instruction*/
        IR::Instr * movInstr = IR::Instr::New(instr->m_opcode, instr->UnlinkDst(), instr->UnlinkSrc1(), instr->m_func);
        instr->InsertBefore(movInstr);

        IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        IR::LabelInstr *helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertAfter(continueLabelInstr);

        IR::RegOpnd *srcReg = movInstr->GetSrc1()->IsRegOpnd() ? movInstr->GetSrc1()->AsRegOpnd() : nullptr;

        this->GenerateStringTest(srcReg, instr, helperLabelInstr, continueLabelInstr);
        this->GenerateBailOut(instr, nullptr, helperLabelInstr);
    }
    else
    {
        instr->ClearBailOutInfo();
    }
}